

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

PrimMeta * tinyusdz::EmptyStaticMeta::GetEmptyStaticMeta(void)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  PrimMeta *__s;
  
  if (s_meta == (PrimMeta *)0x0) {
    __s = (PrimMeta *)operator_new(0x3f8);
    memset(__s,0,0x3e0);
    (__s->_kind_str)._M_dataplus._M_p = (pointer)&(__s->_kind_str).field_2;
    (__s->_kind_str).field_2._M_local_buf[0] = '\0';
    (__s->clips).has_value_ = false;
    *(undefined8 *)&(__s->displayName).contained = 0;
    *(undefined8 *)((long)&(__s->displayName).contained + 8) = 0;
    *(undefined8 *)((long)&(__s->displayName).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->displayName).contained + 0x18) = 0;
    p_Var1 = &(__s->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header;
    (__s->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    *(undefined8 *)&(__s->assetInfo).contained = 0;
    *(undefined8 *)((long)&(__s->assetInfo).contained + 8) = 0;
    *(undefined8 *)((long)&(__s->assetInfo).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->assetInfo).contained + 0x18) = 0;
    *(undefined8 *)((long)&(__s->assetInfo).contained + 0x20) = 0;
    *(undefined8 *)((long)&(__s->assetInfo).contained + 0x28) = 0;
    (__s->customData).has_value_ = false;
    *(undefined8 *)&(__s->customData).contained = 0;
    *(undefined8 *)((long)&(__s->customData).contained + 8) = 0;
    *(undefined8 *)((long)&(__s->customData).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->customData).contained + 0x18) = 0;
    *(undefined8 *)((long)&(__s->customData).contained + 0x20) = 0;
    *(undefined8 *)((long)&(__s->customData).contained + 0x28) = 0;
    (__s->doc).has_value_ = false;
    *(undefined8 *)&(__s->doc).contained = 0;
    *(undefined8 *)((long)&(__s->doc).contained + 8) = 0;
    *(undefined8 *)((long)&(__s->doc).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->doc).contained + 0x18) = 0;
    *(undefined8 *)((long)&(__s->doc).contained + 0x20) = 0;
    *(undefined8 *)((long)&(__s->doc).contained + 0x28) = 0;
    (__s->comment).has_value_ = false;
    (__s->apiSchemas).has_value_ = false;
    *(undefined8 *)((long)&(__s->comment).contained + 0x20) = 0;
    *(undefined8 *)((long)&(__s->comment).contained + 0x28) = 0;
    *(undefined8 *)((long)&(__s->comment).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->comment).contained + 0x18) = 0;
    *(undefined8 *)&(__s->comment).contained = 0;
    *(undefined8 *)((long)&(__s->comment).contained + 8) = 0;
    (__s->sdrMetadata).has_value_ = false;
    *(undefined8 *)((long)&(__s->apiSchemas).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->apiSchemas).contained + 0x18) = 0;
    *(undefined8 *)&(__s->apiSchemas).contained = 0;
    *(undefined8 *)((long)&(__s->apiSchemas).contained + 8) = 0;
    *(undefined8 *)((long)&(__s->sdrMetadata).contained + 0x20) = 0;
    *(undefined8 *)((long)&(__s->sdrMetadata).contained + 0x28) = 0;
    *(undefined8 *)((long)&(__s->sdrMetadata).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->sdrMetadata).contained + 0x18) = 0;
    *(undefined8 *)&(__s->sdrMetadata).contained = 0;
    *(undefined8 *)((long)&(__s->sdrMetadata).contained + 8) = 0;
    (__s->instanceable).has_value_ = false;
    (__s->instanceable).contained = (storage_t<bool>)0x0;
    (__s->references).has_value_ = false;
    *(undefined8 *)((long)&(__s->clips).contained + 0x20) = 0;
    *(undefined8 *)((long)&(__s->clips).contained + 0x28) = 0;
    *(undefined8 *)((long)&(__s->clips).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->clips).contained + 0x18) = 0;
    *(undefined8 *)&(__s->clips).contained = 0;
    *(undefined8 *)((long)&(__s->clips).contained + 8) = 0;
    (__s->payload).has_value_ = false;
    *(undefined8 *)((long)&(__s->references).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->references).contained + 0x18) = 0;
    *(undefined8 *)&(__s->references).contained = 0;
    *(undefined8 *)((long)&(__s->references).contained + 8) = 0;
    (__s->inherits).has_value_ = false;
    *(undefined8 *)((long)&(__s->payload).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->payload).contained + 0x18) = 0;
    *(undefined8 *)&(__s->payload).contained = 0;
    *(undefined8 *)((long)&(__s->payload).contained + 8) = 0;
    (__s->variantSets).has_value_ = false;
    *(undefined8 *)((long)&(__s->inherits).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->inherits).contained + 0x18) = 0;
    *(undefined8 *)&(__s->inherits).contained = 0;
    *(undefined8 *)((long)&(__s->inherits).contained + 8) = 0;
    (__s->variants).has_value_ = false;
    *(undefined8 *)((long)&(__s->variantSets).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->variantSets).contained + 0x18) = 0;
    *(undefined8 *)&(__s->variantSets).contained = 0;
    *(undefined8 *)((long)&(__s->variantSets).contained + 8) = 0;
    (__s->specializes).has_value_ = false;
    *(undefined8 *)((long)&(__s->variants).contained + 0x20) = 0;
    *(undefined8 *)((long)&(__s->variants).contained + 0x28) = 0;
    *(undefined8 *)((long)&(__s->variants).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->variants).contained + 0x18) = 0;
    *(undefined8 *)&(__s->variants).contained = 0;
    *(undefined8 *)((long)&(__s->variants).contained + 8) = 0;
    (__s->sceneName).has_value_ = false;
    *(undefined8 *)((long)&(__s->specializes).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->specializes).contained + 0x18) = 0;
    *(undefined8 *)&(__s->specializes).contained = 0;
    *(undefined8 *)((long)&(__s->specializes).contained + 8) = 0;
    (__s->displayName).has_value_ = false;
    *(undefined8 *)((long)&(__s->sceneName).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->sceneName).contained + 0x18) = 0;
    *(undefined8 *)&(__s->sceneName).contained = 0;
    *(undefined8 *)((long)&(__s->sceneName).contained + 8) = 0;
    (__s->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__s->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    p_Var2 = &(__s->meta)._M_t._M_impl.super__Rb_tree_header;
    (__s->meta)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__s->meta)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    (__s->meta)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    *(undefined8 *)((long)&(__s->variantSetChildren).contained + 0x10) = 0;
    *(undefined8 *)&(__s->variantSetChildren).contained = 0;
    *(undefined8 *)((long)&(__s->variantSetChildren).contained + 8) = 0;
    *(undefined8 *)
     ((long)&(__s->properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__s->properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
    (__s->properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__s->properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__s->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__s->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__s->meta)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (__s->primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__s->variantChildren).has_value_ = false;
    *(undefined8 *)((long)&(__s->inheritPaths).contained + 0x10) = 0;
    *(undefined8 *)((long)&(__s->inheritPaths).contained + 0x18) = 0;
    *(undefined8 *)&(__s->inheritPaths).contained = 0;
    *(undefined8 *)((long)&(__s->inheritPaths).contained + 8) = 0;
    *(undefined8 *)((long)&(__s->variantChildren).contained + 9) = 0;
    *(undefined8 *)((long)&(__s->variantChildren).contained + 0x11) = 0;
    *(undefined8 *)&(__s->variantChildren).contained = 0;
    *(undefined8 *)((long)&(__s->variantChildren).contained + 8) = 0;
    s_meta = __s;
  }
  return s_meta;
}

Assistant:

static PrimMeta &GetEmptyStaticMeta() {
    if (!s_meta) {
      s_meta = new PrimMeta();
    }

    return *s_meta;
  }